

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_newc.c
# Opt level: O0

int from_hex(char *p,size_t l)

{
  int iVar1;
  int r;
  size_t l_local;
  char *p_local;
  
  r = 0;
  p_local = p;
  for (l_local = l; l_local != 0; l_local = l_local - 1) {
    if ((*p_local < 'a') || ('f' < *p_local)) {
      if ((*p_local < 'A') || ('F' < *p_local)) {
        iVar1 = *p_local + -0x30;
      }
      else {
        iVar1 = *p_local + -0x37;
      }
    }
    else {
      iVar1 = *p_local + -0x57;
    }
    r = iVar1 + r * 0x10;
    p_local = p_local + 1;
  }
  return r;
}

Assistant:

static int
from_hex(const char *p, size_t l)
{
	int r = 0;

	while (l > 0) {
		r *= 16;
		if (*p >= 'a' && *p <= 'f')
			r += *p + 10 - 'a';
		else if (*p >= 'A' && *p <= 'F')
			r += *p + 10 - 'A';
		else
			r += *p - '0';
		--l;
		++p;
	}
	return (r);
}